

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_ssse3_intr.c
# Opt level: O2

void ihevc_intra_pred_luma_ref_substitution_ssse3
               (UWORD8 *pu1_top_left,UWORD8 *pu1_top,UWORD8 *pu1_left,WORD32 src_strd,WORD32 nt,
               WORD32 nbr_flags,UWORD8 *pu1_dst,WORD32 dst_strd)

{
  uint *puVar1;
  UWORD8 UVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  uint local_44 [7];
  
  if (nbr_flags == 0) {
    uVar3 = nt * 4 + 1;
    uVar11 = 0;
    uVar9 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar9 = uVar11;
    }
    for (; uVar9 != uVar11; uVar11 = uVar11 + 1) {
      pu1_dst[uVar11] = 0x80;
    }
    return;
  }
  uVar4 = nt * 2;
  lVar7 = (long)(int)uVar4;
  pu1_dst[lVar7] = *pu1_top_left;
  uVar3 = 0;
  if (0 < (int)uVar4) {
    uVar3 = uVar4;
  }
  uVar9 = (ulong)uVar3;
  while( true ) {
    uVar4 = uVar4 - 1;
    bVar12 = uVar9 == 0;
    uVar9 = uVar9 - 1;
    if (bVar12) break;
    pu1_dst[(int)uVar4] = *pu1_left;
    pu1_left = pu1_left + src_strd;
  }
  for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
    pu1_dst[uVar9 + lVar7 + 1] = pu1_top[uVar9];
  }
  if (nt < 9) {
    local_44[1] = (uint)nbr_flags >> 0x10 & 1;
    local_44[0] = (uint)nbr_flags >> 7 & 1;
    local_44[2] = (uint)nbr_flags >> 8 & 1;
    local_44[3] = (uint)nbr_flags >> 0xc & 1;
    if ((nbr_flags & 8U) == 0) {
      iVar8 = 0;
      uVar9 = 0;
      do {
        iVar8 = iVar8 + nt;
        puVar1 = local_44 + uVar9;
        uVar9 = uVar9 + 1;
      } while (*puVar1 == 0);
      if (uVar9 < 3) {
        UVar2 = pu1_dst[iVar8];
        for (lVar10 = 0; lVar10 < iVar8; lVar10 = lVar10 + 1) {
          pu1_dst[lVar10] = UVar2;
        }
      }
      else {
        UVar2 = pu1_dst[(long)(iVar8 - nt) + 1];
        for (lVar10 = 0; lVar10 <= iVar8 - nt; lVar10 = lVar10 + 1) {
          pu1_dst[lVar10] = UVar2;
        }
      }
    }
    if (local_44[0] == 0) {
      uVar9 = 0;
      uVar11 = 0;
      if (0 < nt) {
        uVar11 = (ulong)(uint)nt;
      }
      for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
        pu1_dst[uVar9 + (long)nt] = pu1_dst[(long)nt + -1];
      }
    }
    if (local_44[1] == 0) {
      pu1_dst[lVar7] = pu1_dst[lVar7 + -1];
    }
    if (local_44[2] == 0) {
      uVar9 = 0;
      uVar11 = 0;
      if (0 < nt) {
        uVar11 = (ulong)(uint)nt;
      }
      for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
        pu1_dst[uVar9 + lVar7 + 1] = pu1_dst[lVar7];
      }
    }
    if (local_44[3] == 0) {
      uVar9 = 0;
      uVar11 = 0;
      if (0 < nt) {
        uVar11 = (ulong)(uint)nt;
      }
      for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
        pu1_dst[uVar9 + (long)(nt * 3) + 1] = pu1_dst[nt * 3];
      }
    }
  }
  if (nt != 0x20) {
    if (nt != 0x10) {
      return;
    }
    uVar6 = (uint)nbr_flags >> 4 & 0xc | (uint)nbr_flags >> 2 & 3;
    uVar4 = (uint)nbr_flags >> 6 & 0xc0 | (uint)nbr_flags >> 4 & 0x30;
    uVar3 = (uint)nbr_flags >> 8 & 0x100;
    if (uVar6 == 0) {
      if (((uint)nbr_flags >> 0x10 & 1) == 0) {
        if (uVar4 == 0) {
          uVar5 = 0x61;
        }
        else {
          iVar8 = 0;
          if (uVar4 >> 4 != 0) {
            for (; ((uVar4 >> 4) >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
            }
          }
          uVar5 = iVar8 * 8 + 0x21;
        }
      }
      else {
        uVar5 = 0x20;
      }
    }
    else {
      iVar8 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
        }
      }
      if (iVar8 == 0) {
        uVar5 = 0;
        goto LAB_00131906;
      }
      uVar5 = iVar8 << 3;
    }
    uVar9 = (ulong)uVar5;
    UVar2 = pu1_dst[uVar9];
    for (; 0 < (long)uVar9; uVar9 = uVar9 - 1) {
      pu1_dst[uVar9 - 1] = UVar2;
    }
LAB_00131906:
    for (; (int)uVar5 < 0x41; uVar5 = uVar5 + iVar8) {
      if (uVar5 == 0x20) {
        iVar8 = 1;
        if (uVar3 == 0) {
          pu1_dst[0x20] = pu1_dst[0x1f];
          iVar8 = 1;
        }
      }
      else {
        iVar8 = 8;
        if (((uVar4 + uVar3 | uVar6) >> (uVar5 >> 3 & 0x1f) & 1) == 0) {
          UVar2 = pu1_dst[(long)(int)uVar5 + -1];
          for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
            pu1_dst[lVar7 + (int)uVar5] = UVar2;
          }
          iVar8 = 8;
        }
      }
    }
    return;
  }
  uVar3 = nbr_flags & 0xff;
  if (uVar3 == 0) {
    if (((uint)nbr_flags >> 0x10 & 1) == 0) {
      uVar3 = (uint)nbr_flags >> 8 & 0xff;
      if (uVar3 == 0) {
        uVar3 = 0x81;
      }
      else {
        iVar8 = 0;
        if (uVar3 != 0) {
          for (; (uVar3 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
          }
        }
        uVar3 = iVar8 * 8 + 0x41;
      }
    }
    else {
      uVar3 = 0x40;
    }
  }
  else {
    iVar8 = 0;
    if (uVar3 != 0) {
      for (; (uVar3 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
      }
    }
    if (iVar8 == 0) {
      uVar3 = 0;
      goto LAB_00131977;
    }
    uVar3 = iVar8 << 3;
  }
  uVar9 = (ulong)uVar3;
  UVar2 = pu1_dst[uVar9];
  for (; 0 < (long)uVar9; uVar9 = uVar9 - 1) {
    pu1_dst[uVar9 - 1] = UVar2;
  }
LAB_00131977:
  for (; (int)uVar3 < 0x81; uVar3 = uVar3 + iVar8) {
    if (uVar3 == 0x40) {
      iVar8 = 1;
      if (((uint)nbr_flags >> 0x10 & 1) == 0) {
        pu1_dst[0x40] = pu1_dst[0x3f];
        iVar8 = 1;
      }
    }
    else {
      iVar8 = 8;
      if (((uint)nbr_flags >> (uVar3 >> 3 & 0x1f) & 1) == 0) {
        UVar2 = pu1_dst[(long)(int)uVar3 + -1];
        for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
          pu1_dst[lVar7 + (int)uVar3] = UVar2;
        }
        iVar8 = 8;
      }
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_ref_substitution_ssse3(UWORD8 *pu1_top_left,
                                                  UWORD8 *pu1_top,
                                                  UWORD8 *pu1_left,
                                                  WORD32 src_strd,
                                                  WORD32 nt,
                                                  WORD32 nbr_flags,
                                                  UWORD8 *pu1_dst,
                                                  WORD32 dst_strd)
{
    UWORD8 pu1_ref;
    WORD32 dc_val, i;
    WORD32 total_samples = (4 * nt) + 1;
    WORD32 two_nt = 2 * nt;

    WORD32 three_nt = 3 * nt;
    WORD32 get_bits;
    WORD32 next;
    WORD32 bot_left, left, top, tp_right, tp_left;

    WORD32 idx, nbr_id_from_bl, frwd_nbr_flag;
    UNUSED(dst_strd);

    dc_val = 1 << (BIT_DEPTH - 1);


    /* Neighbor Flag Structure*/
    /* MSB ---> LSB */
    /*    Top-Left | Top-Right | Top | Left | Bottom-Left
              1         4         4     4         4
     */
    /* If no neighbor flags are present, fill the neighbor samples with DC value */
    if(nbr_flags == 0)
    {
        for(i = 0; i < total_samples; i++)
        {
            pu1_dst[i] = dc_val;
        }
    }
    else
    {
        /* Else fill the corresponding samples */
        pu1_dst[two_nt] = *pu1_top_left;
        for(i = 0; i < two_nt; i++)
            pu1_dst[two_nt - 1 - i] = pu1_left[i * src_strd];
        for(i = 0; i < two_nt; i++)
            pu1_dst[two_nt + 1 + i] = pu1_top[i];

        if(nt <= 8)
        {
            /* 1 bit extraction for all the neighboring blocks */
            tp_left = (nbr_flags & 0x10000) >> 16;
            bot_left = (nbr_flags & 0x8) >> 3;
            left = (nbr_flags & 0x80) >> 7;
            top = (nbr_flags & 0x100) >> 8;
            tp_right = (nbr_flags & 0x1000) >> 12;

            next = 1;

            /* If bottom -left is not available, reverse substitution process*/
            if(bot_left == 0)
            {
                WORD32 a_nbr_flag[5] = { bot_left, left, tp_left, top, tp_right };

                /* Check for the 1st available sample from bottom-left*/
                while(!a_nbr_flag[next])
                    next++;

                /* If Left, top-left are available*/
                if(next <= 2)
                {
                    idx = nt * next;
                    pu1_ref = pu1_dst[idx];
                    for(i = 0; i < idx; i++)
                        pu1_dst[i] = pu1_ref;
                }
                else /* If top, top-right are available */
                {
                    /* Idx is changed to copy 1 pixel value for top-left ,if top-left is not available*/
                    idx = (nt * (next - 1)) + 1;
                    pu1_ref = pu1_dst[idx];
                    for(i = 0; i < idx; i++)
                        pu1_dst[i] = pu1_ref;
                }
            }

            /* Forward Substitution Process */
            /* If left is Unavailable, copy the last bottom-left value */
            if(left == 0)
            {
                for(i = 0; i < nt; i++)
                    pu1_dst[nt + i] = pu1_dst[nt - 1];
            }
            /* If top-left is Unavailable, copy the last left value */
            if(tp_left == 0)
                pu1_dst[two_nt] = pu1_dst[two_nt - 1];
            /* If top is Unavailable, copy the last top-left value */
            if(top == 0)
            {
                for(i = 0; i < nt; i++)
                    pu1_dst[two_nt + 1 + i] = pu1_dst[two_nt];
            }
            /* If to right is Unavailable, copy the last top value */
            if(tp_right == 0)
            {
                for(i = 0; i < nt; i++)
                    pu1_dst[three_nt + 1 + i] = pu1_dst[three_nt];
            }
        }

        if(nt == 16)
        {
            WORD32 nbr_flags_temp = 0;
            nbr_flags_temp = ((nbr_flags & 0xC) >> 2) + ((nbr_flags & 0xC0) >> 4)
                            + ((nbr_flags & 0x300) >> 4)
                            + ((nbr_flags & 0x3000) >> 6)
                            + ((nbr_flags & 0x10000) >> 8);

            /* compute trailing zeors based on nbr_flag for substitution process of below left see section .*/
            /* as each bit in nbr flags corresponds to 8 pels for bot_left, left, top and topright but 1 pel for topleft */
            {
                nbr_id_from_bl = look_up_trailing_zeros(nbr_flags_temp & 0XF) * 8; /* for below left and left */

                if(nbr_id_from_bl == 64)
                    nbr_id_from_bl = 32;

                if(nbr_id_from_bl == 32)
                {
                    /* for top left : 1 pel per nbr bit */
                    if(!((nbr_flags_temp >> 8) & 0x1))
                    {
                        nbr_id_from_bl++;
                        nbr_id_from_bl += look_up_trailing_zeros((nbr_flags_temp >> 4) & 0xF) * 8; /* top and top right;  8 pels per nbr bit */
                        //nbr_id_from_bl += idx * 8;
                    }
                }
                /* Reverse Substitution Process*/
                if(nbr_id_from_bl)
                {
                    /* Replicate the bottom-left and subsequent unavailable pixels with the 1st available pixel above */
                    pu1_ref = pu1_dst[nbr_id_from_bl];
                    for(i = (nbr_id_from_bl - 1); i >= 0; i--)
                    {
                        pu1_dst[i] = pu1_ref;
                    }
                }
            }

            /* for the loop of 4*Nt+1 pixels (excluding pixels computed from reverse substitution) */
            while(nbr_id_from_bl < ((T16_4NT) + 1))
            {
                /* To Obtain the next unavailable idx flag after reverse neighbor substitution  */
                /* Devide by 8 to obtain the original index */
                frwd_nbr_flag = (nbr_id_from_bl >> 3); /*+ (nbr_id_from_bl & 0x1);*/

                /* The Top-left flag is at the last bit location of nbr_flags*/
                if(nbr_id_from_bl == (T16_4NT / 2))
                {
                    get_bits = GET_BITS(nbr_flags_temp, 8);

                    /* only pel substitution for TL */
                    if(!get_bits)
                        pu1_dst[nbr_id_from_bl] = pu1_dst[nbr_id_from_bl - 1];
                }
                else
                {
                    get_bits = GET_BITS(nbr_flags_temp, frwd_nbr_flag);
                    if(!get_bits)
                    {
                        /* 8 pel substitution (other than TL) */
                        pu1_ref = pu1_dst[nbr_id_from_bl - 1];
                        for(i = 0; i < 8; i++)
                            pu1_dst[nbr_id_from_bl + i] = pu1_ref;
                    }

                }
                nbr_id_from_bl += (nbr_id_from_bl == (T16_4NT / 2)) ? 1 : 8;
            }


        }

        if(nt == 32)
        {
            /* compute trailing ones based on mbr_flag for substitution process of below left see section .*/
            /* as each bit in nbr flags corresponds to 8 pels for bot_left, left, top and topright but 1 pel for topleft */
            {
                nbr_id_from_bl = look_up_trailing_zeros((nbr_flags & 0XFF)) * 8; /* for below left and left */

                if(nbr_id_from_bl == 64)
                {
                    /* for top left : 1 pel per nbr bit */
                    if(!((nbr_flags >> 16) & 0x1))
                    {
                        /* top left not available */
                        nbr_id_from_bl++;
                        /* top and top right;  8 pels per nbr bit */
                        nbr_id_from_bl += look_up_trailing_zeros((nbr_flags >> 8) & 0xFF) * 8;
                    }
                }
                /* Reverse Substitution Process*/
                if(nbr_id_from_bl)
                {
                    /* Replicate the bottom-left and subsequent unavailable pixels with the 1st available pixel above */
                    pu1_ref = pu1_dst[nbr_id_from_bl];
                    for(i = (nbr_id_from_bl - 1); i >= 0; i--)
                        pu1_dst[i] = pu1_ref;
                }
            }

            /* for the loop of 4*Nt+1 pixels (excluding pixels computed from reverse substitution) */
            while(nbr_id_from_bl < ((T32_4NT) + 1))
            {
                /* To Obtain the next unavailable idx flag after reverse neighbor substitution  */
                /* Devide by 8 to obtain the original index */
                frwd_nbr_flag = (nbr_id_from_bl >> 3); /*+ (nbr_id_from_bl & 0x1);*/

                /* The Top-left flag is at the last bit location of nbr_flags*/
                if(nbr_id_from_bl == (T32_4NT / 2))
                {
                    get_bits = GET_BITS(nbr_flags, 16);
                    /* only pel substitution for TL */
                    if(!get_bits)
                        pu1_dst[nbr_id_from_bl] = pu1_dst[nbr_id_from_bl - 1];
                }
                else
                {
                    get_bits = GET_BITS(nbr_flags, frwd_nbr_flag);
                    if(!get_bits)
                    {
                        /* 8 pel substitution (other than TL) */
                        pu1_ref = pu1_dst[nbr_id_from_bl - 1];
                        for(i = 0; i < 8; i++)
                            pu1_dst[nbr_id_from_bl + i] = pu1_ref;
                    }

                }
                nbr_id_from_bl += (nbr_id_from_bl == (T32_4NT / 2)) ? 1 : 8;
            }
        }

    }
}